

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::StringMatcherBase::describe_abi_cxx11_
          (string *__return_storage_ptr__,StringMatcherBase *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  string local_70;
  string local_40;
  undefined1 local_19;
  StringMatcherBase *local_18;
  StringMatcherBase *this_local;
  string *description;
  
  local_19 = 0;
  local_18 = this;
  this_local = (StringMatcherBase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size(&this->m_operation);
  sVar2 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size(&(this->m_comparator).m_str);
  CasedString::caseSensitivitySuffix_abi_cxx11_(&local_40,&this->m_comparator);
  sVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size(&local_40);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,sVar1 + 5 + sVar2 + sVar3);
  std::__cxx11::string::~string((string *)&local_40);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&this->m_operation);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,": \"");
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&(this->m_comparator).m_str);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"\"");
  CasedString::caseSensitivitySuffix_abi_cxx11_(&local_70,&this->m_comparator);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMatcherBase::describe() const {
            std::string description;
            description.reserve(5 + m_operation.size() + m_comparator.m_str.size() +
                                        m_comparator.caseSensitivitySuffix().size());
            description += m_operation;
            description += ": \"";
            description += m_comparator.m_str;
            description += "\"";
            description += m_comparator.caseSensitivitySuffix();
            return description;
        }